

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phone.cpp
# Opt level: O0

void __thiscall state_machine::Phone::Phone(Phone *this)

{
  initializer_list<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_> __l;
  initializer_list<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_> __l_00;
  initializer_list<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_> __l_01;
  initializer_list<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_> __l_02;
  initializer_list<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_> __l_03;
  initializer_list<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_> __l_04;
  mapped_type *pmVar1;
  key_type local_144;
  State local_140;
  Action local_13c;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_138;
  iterator local_130;
  size_type local_128;
  key_type local_11c;
  State local_118;
  Action local_114;
  State local_110;
  Action local_10c;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_108;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_100;
  iterator local_f8;
  size_type local_f0;
  key_type local_e4;
  State local_e0;
  Action local_dc;
  State local_d8;
  Action local_d4;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_d0;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_c8;
  iterator local_c0;
  size_type local_b8;
  key_type local_ac;
  State local_a8;
  Action local_a4;
  State local_a0;
  Action local_9c;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_98;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_90;
  iterator local_88;
  size_type local_80;
  key_type local_74;
  State local_70;
  Action local_6c;
  State local_68;
  Action local_64;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_60;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_58;
  iterator local_50;
  size_type local_48;
  key_type local_40 [4];
  State local_30;
  Action local_2c;
  pair<state_machine::Phone::Action,_state_machine::Phone::State> local_28;
  iterator local_20;
  size_type local_18;
  Phone *local_10;
  Phone *this_local;
  
  local_10 = this;
  std::
  map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
  ::map(&this->m_rules);
  this->m_current_state = on_hook;
  local_2c = take_off_hook;
  local_30 = off_hook;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_28,&local_2c,&local_30);
  local_20 = &local_28;
  local_18 = 1;
  local_40[0] = on_hook;
  pmVar1 = std::
           map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
           ::operator[](&this->m_rules,local_40);
  __l_04._M_len = local_18;
  __l_04._M_array = local_20;
  std::
  vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>
  ::operator=(pmVar1,__l_04);
  local_64 = dialing;
  local_68 = dialing;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_60,&local_64,&local_68);
  local_6c = put_on_hook;
  local_70 = on_hook;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_58,&local_6c,&local_70);
  local_50 = &local_60;
  local_48 = 2;
  local_74 = off_hook;
  pmVar1 = std::
           map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
           ::operator[](&this->m_rules,&local_74);
  __l_03._M_len = local_48;
  __l_03._M_array = local_50;
  std::
  vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>
  ::operator=(pmVar1,__l_03);
  local_9c = calling;
  local_a0 = connecting;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_98,&local_9c,&local_a0);
  local_a4 = put_on_hook;
  local_a8 = on_hook;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_90,&local_a4,&local_a8);
  local_88 = &local_98;
  local_80 = 2;
  local_ac = dialing;
  pmVar1 = std::
           map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
           ::operator[](&this->m_rules,&local_ac);
  __l_02._M_len = local_80;
  __l_02._M_array = local_88;
  std::
  vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>
  ::operator=(pmVar1,__l_02);
  local_d4 = put_on_hold;
  local_d8 = on_hold;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_d0,&local_d4,&local_d8);
  local_dc = put_on_hook;
  local_e0 = disconnecting;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_c8,&local_dc,&local_e0);
  local_c0 = &local_d0;
  local_b8 = 2;
  local_e4 = connected;
  pmVar1 = std::
           map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
           ::operator[](&this->m_rules,&local_e4);
  __l_01._M_len = local_b8;
  __l_01._M_array = local_c0;
  std::
  vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>
  ::operator=(pmVar1,__l_01);
  local_10c = take_off_hold;
  local_110 = connected;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_108,&local_10c,&local_110);
  local_114 = put_on_hook;
  local_118 = disconnecting;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_100,&local_114,&local_118);
  local_f8 = &local_108;
  local_f0 = 2;
  local_11c = on_hold;
  pmVar1 = std::
           map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
           ::operator[](&this->m_rules,&local_11c);
  __l_00._M_len = local_f0;
  __l_00._M_array = local_f8;
  std::
  vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>
  ::operator=(pmVar1,__l_00);
  local_13c = put_on_hook;
  local_140 = on_hook;
  std::pair<state_machine::Phone::Action,_state_machine::Phone::State>::
  pair<state_machine::Phone::Action,_state_machine::Phone::State,_true>
            (&local_138,&local_13c,&local_140);
  local_130 = &local_138;
  local_128 = 1;
  local_144 = disconnected;
  pmVar1 = std::
           map<state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>,_std::less<state_machine::Phone::State>,_std::allocator<std::pair<const_state_machine::Phone::State,_std::vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>_>_>_>
           ::operator[](&this->m_rules,&local_144);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::
  vector<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>,_std::allocator<std::pair<state_machine::Phone::Action,_state_machine::Phone::State>_>_>
  ::operator=(pmVar1,__l);
  return;
}

Assistant:

Phone::Phone() {
    m_rules[State::on_hook] = {
        {Action::take_off_hook, State::off_hook}};

    m_rules[State::off_hook] = {
        {Action::dialing, State::dialing},
        {Action::put_on_hook, State::on_hook}};

    m_rules[State::dialing] = {
        {Action::calling, State::connecting},
        {Action::put_on_hook, State::on_hook}};

    m_rules[State::connected] = {
        {Action::put_on_hold, State::on_hold},
        {Action::put_on_hook, State::disconnecting}};

    m_rules[State::on_hold] = {
        {Action::take_off_hold, State::connected},
        {Action::put_on_hook, State::disconnecting}};

    m_rules[State::disconnected] = {
        {Action::put_on_hook, State::on_hook}};
}